

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckHeader.cxx
# Opt level: O1

bool __thiscall
kws::Parser::CheckHeader(Parser *this,char *filename,bool considerSpaceEOL,bool useCVS)

{
  char cVar1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  Status SVar8;
  unsigned_long uVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  pointer pcVar13;
  long lVar14;
  undefined7 in_register_00000011;
  _Alloc_hider _Var15;
  ulong uVar16;
  pointer pbVar17;
  bool bVar18;
  bool bVar19;
  char *pcVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer pvVar22;
  int iVar23;
  uint uVar25;
  value_type *__x;
  pointer __x_00;
  pointer pcVar26;
  bool bVar27;
  string fullpath;
  string wordh;
  string file;
  string word;
  Directory directory;
  string headerFilename;
  ErrorVectorType tempErrorVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  tempErrors;
  string dirname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  ulong local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [24];
  char local_320 [8];
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  char *local_300;
  char *local_2f8;
  char local_2f0 [16];
  string *local_2e0;
  Directory local_2d8;
  value_type local_2d0;
  undefined4 local_2ac;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  local_268;
  long local_250;
  string *local_248;
  pointer local_240;
  string local_238 [16];
  int iVar24;
  
  local_2ac = (undefined4)CONCAT71(in_register_00000011,considerSpaceEOL);
  this->m_TestsDone[0xd] = true;
  pcVar5 = (char *)operator_new__(0xff);
  builtin_strncpy(pcVar5,"The header should respect the template",0x27);
  pcVar10 = (char *)this->m_TestsDescription[0xd]._M_string_length;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0xd),0,pcVar10,(ulong)pcVar5);
  operator_delete__(pcVar5);
  if (filename == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "CheckHeader(): Please specify an header file or a directory containing headers",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    bVar18 = false;
  }
  else {
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    sVar6 = strlen(filename);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,filename,filename + sVar6);
    lVar7 = std::__cxx11::string::find((char)&local_2d0,0x20);
    if ((lVar7 == -1) &&
       (std::__cxx11::string::_M_replace
                  ((ulong)&local_2d0,0,(char *)local_2d0._M_string_length,0x16b513),
       *filename != '\0')) {
      uVar16 = 0;
      do {
        if (filename[uVar16] != '\"') {
          std::__cxx11::string::push_back((char)&local_2d0);
        }
        uVar16 = uVar16 + 1;
        sVar6 = strlen(filename);
      } while (uVar16 < sVar6);
    }
    if (*local_2d0._M_dataplus._M_p == '\"') {
      std::__cxx11::string::substr((ulong)local_238,(ulong)&local_2d0);
      std::__cxx11::string::operator=((string *)&local_2d0,(string *)local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p);
      }
    }
    kwssys::Directory::Directory(&local_2d8);
    std::__cxx11::string::string
              ((string *)local_238,local_2d0._M_dataplus._M_p,(allocator *)local_338);
    SVar8 = kwssys::Directory::Load(&local_2d8,local_238,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p);
    }
    if (SVar8.Kind_ == Success) {
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_2d0._M_dataplus._M_p,
                 (char *)(local_2d0._M_string_length + (long)local_2d0._M_dataplus._M_p));
      if (local_238[0]._M_dataplus._M_p[local_238[0]._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)local_238);
      }
      uVar25 = 0;
      while( true ) {
        uVar9 = kwssys::Directory::GetNumberOfFiles(&local_2d8);
        if (uVar9 <= uVar25) break;
        pcVar10 = kwssys::Directory::GetFile(&local_2d8,(ulong)uVar25);
        std::__cxx11::string::string((string *)local_338,pcVar10,(allocator *)&local_380);
        std::operator+(&local_380,local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338);
        iVar4 = std::__cxx11::string::compare((char *)local_338);
        if ((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)local_338), iVar4 != 0)
             ) && (iVar4 = std::__cxx11::string::compare((char *)local_338), iVar4 != 0)) &&
           (iVar4 = std::__cxx11::string::compare((char *)local_338), iVar4 != 0)) {
          std::operator+(&local_358,local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_338);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288
                     ,&local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_);
        }
        uVar25 = uVar25 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_288,&local_2d0);
    }
    local_268.
    super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_288.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar19 = true;
    }
    else {
      local_2e0 = &this->m_Buffer;
      local_248 = (string *)&this->m_HeaderFilename;
      pbVar17 = local_288.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar18 = !useCVS;
      do {
        std::ifstream::ifstream(local_238);
        std::ifstream::open((char *)local_238,(_Ios_Openmode)(pbVar17->_M_dataplus)._M_p);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Cannot open header file: ",0x19);
          pcVar10 = (pbVar17->_M_dataplus)._M_p;
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x199368);
          }
          else {
            sVar6 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,sVar6);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
          std::ostream::put('h');
          std::ostream::flush();
          bVar19 = true;
          bVar27 = false;
          bVar18 = false;
        }
        else {
          std::istream::seekg((long)local_238,_S_beg);
          lVar7 = std::istream::tellg();
          std::istream::seekg((long)local_238,_S_beg);
          pcVar10 = (char *)operator_new__(lVar7 + 1);
          std::istream::read((char *)local_238,(long)pcVar10);
          pcVar10[lVar7] = '\0';
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          sVar6 = strlen(pcVar10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_380,pcVar10,pcVar10 + sVar6);
          std::__cxx11::string::resize((ulong)&local_380,(char)lVar7);
          std::ifstream::close();
          operator_delete__(pcVar10);
          ConvertBufferToWindowsFileType(this,&local_380);
          local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_start = (value_type *)0x0;
          local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_finish = (value_type *)0x0;
          local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pcVar10 = (local_2e0->_M_dataplus)._M_p;
          uVar25 = 0;
          local_240 = pbVar17;
          if (local_380._M_string_length != 0) {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_380._M_dataplus._M_p + local_380._M_string_length);
            pcVar26 = (pointer)0xffffffffffffffff;
            bVar27 = false;
            uVar16 = 0;
            _Var15._M_p = local_380._M_dataplus._M_p;
LAB_0014bd0e:
            pcVar5 = (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length;
            if (pcVar10 != pcVar5) {
              if (*_Var15._M_p == '$' && useCVS) {
                do {
                  _Var15._M_p = _Var15._M_p + 1;
                  uVar16 = (ulong)((int)uVar16 + 1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var15._M_p == paVar11) break;
                } while (*_Var15._M_p != '$');
                do {
                  pcVar10 = pcVar10 + 1;
                  uVar25 = uVar25 + 1;
                  if (pcVar10 == pcVar5) break;
                } while (*pcVar10 != '$');
              }
              iVar4 = (int)uVar16;
              cVar3 = *pcVar10;
              cVar1 = *_Var15._M_p;
              if (cVar3 != cVar1) {
                if (cVar1 == '<') {
                  local_360 = std::__cxx11::string::find((char *)&local_380,0x1781bb,uVar16);
                  uVar12 = std::__cxx11::string::find((char *)&local_380,0x1781c0,uVar16);
                  if (uVar12 == uVar16) {
                    if (*_Var15._M_p != '\n') {
                      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)_Var15._M_p;
                      do {
                        _Var15._M_p = (pointer)paVar11;
                        if (paVar11 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_380._M_dataplus._M_p + local_380._M_string_length)) break;
                        _Var15._M_p = paVar11->_M_local_buf + 1;
                        uVar16 = (ulong)((int)uVar16 + 1);
                        pcVar5 = paVar11->_M_local_buf + 1;
                        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)_Var15._M_p;
                      } while (*pcVar5 != '\n');
                    }
                    if (*pcVar10 == '\n') {
LAB_0014bf60:
                      bVar19 = false;
                    }
                    else {
                      do {
                        if (pcVar10 ==
                            (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length)
                        goto LAB_0014bf60;
                        uVar25 = uVar25 + 1;
                        pcVar5 = pcVar10 + 1;
                        pcVar20 = pcVar10 + 1;
                        pcVar10 = pcVar5;
                      } while (*pcVar20 != '\n');
LAB_0014bf8c:
                      bVar19 = false;
                      pcVar10 = pcVar5;
                    }
                  }
                  else {
                    bVar19 = true;
                    if (local_360 == uVar16) {
                      if (*_Var15._M_p != ' ') {
                        do {
                          if (_Var15._M_p == local_380._M_dataplus._M_p + local_380._M_string_length
                             ) break;
                          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)(_Var15._M_p + 1);
                          uVar16 = (ulong)((int)uVar16 + 1);
                          pcVar5 = _Var15._M_p + 1;
                          _Var15._M_p = (pointer)paVar11;
                        } while (*pcVar5 != ' ');
                      }
                      if (*pcVar10 == ' ') goto LAB_0014bf60;
                      do {
                        if (pcVar10 ==
                            (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length)
                        goto LAB_0014bf60;
                        uVar25 = uVar25 + 1;
                        pcVar5 = pcVar10 + 1;
                        pcVar20 = pcVar10 + 1;
                        pcVar10 = pcVar5;
                      } while (*pcVar20 != ' ');
                      goto LAB_0014bf8c;
                    }
                  }
                  goto joined_r0x0014bebc;
                }
                if (((char)local_2ac == '\0') && ((cVar3 == ' ' || (cVar1 == ' ')))) {
                  if (cVar3 == ' ') {
                    bVar19 = true;
                    for (pcVar20 = pcVar10; pcVar20 != pcVar5; pcVar20 = pcVar20 + 1) {
                      cVar3 = *pcVar20;
                      if (cVar3 != ' ') goto LAB_0014be7f;
                    }
                  }
                  else {
                    bVar19 = true;
                    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)_Var15._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var15._M_p != paVar11 && cVar1 == ' ') {
                      do {
                        cVar3 = paVar21->_M_local_buf[0];
                        if (cVar3 != ' ') goto LAB_0014be7f;
                        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(paVar21->_M_local_buf + 1);
                      } while (paVar21 != paVar11);
                    }
                  }
                  goto joined_r0x0014bebc;
                }
                goto LAB_0014bfb0;
              }
              goto LAB_0014c47a;
            }
            goto LAB_0014c565;
          }
          bVar27 = false;
LAB_0014c565:
          pbVar17 = local_240;
          if (pcVar10 == (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length) {
            local_320 = (char  [8])&local_310;
            local_318 = 0;
            local_310._M_local_buf[0] = '\0';
            local_338._0_8_ = (pointer)0x1;
            local_338._8_8_ = (pointer)0x1;
            local_338._16_8_ = 0xd;
            std::__cxx11::string::_M_replace((ulong)local_320,0,(char *)0x0,0x178209);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&local_2a8,(value_type *)local_338);
            if (local_320 != (char  [8])&local_310) {
              operator_delete((void *)local_320);
            }
            bVar27 = true;
          }
          if (bVar27) {
            std::
            vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
            ::push_back(&local_268,&local_2a8);
            pbVar17 = pbVar17 + 1;
          }
          else {
            std::__cxx11::string::_M_assign(local_248);
            bVar18 = true;
            for (__x_00 = local_2a8.
                          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                __x_00 != local_2a8.
                          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                          _M_impl.super__Vector_impl_data._M_finish; __x_00 = __x_00 + 1) {
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,__x_00);
            }
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&local_2a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p);
          }
          bVar19 = (bool)(bVar27 ^ 1);
        }
        std::ifstream::~ifstream(local_238);
        if (bVar27 == false) goto LAB_0014c792;
      } while (pbVar17 !=
               local_288.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar18 = bVar19;
    uVar12 = 0;
    uVar16 = uVar12;
    if (local_268.
        super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_268.
        super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar4 = 9999999;
      uVar16 = 0;
      pvVar22 = local_268.
                super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar24 = (int)((ulong)((long)(pvVar22->
                                     super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar22->
                                    super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar23 = iVar24 * -0x49249249;
        bVar27 = iVar4 + iVar24 * 0x49249249 < 0;
        if (iVar4 != iVar23 && SBORROW4(iVar4,iVar23) == bVar27) {
          uVar16 = uVar12;
        }
        if (SBORROW4(iVar4,iVar23) == bVar27) {
          iVar4 = iVar23;
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pvVar22 = pvVar22 + 1;
      } while (pvVar22 !=
               local_268.
               super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    __x = local_268.
          super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].
          super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (__x != local_268.
               super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
               super__Vector_impl_data._M_finish) {
      do {
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,__x);
        __x = __x + 1;
      } while (__x != local_268.
                      super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].
                      super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::_M_assign((string *)&this->m_HeaderFilename);
LAB_0014c792:
    std::
    vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ::~vector(&local_268);
    kwssys::Directory::~Directory(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
  }
  return bVar18;
LAB_0014be7f:
  bVar19 = true;
  if (cVar3 != '\n') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p != paVar11) {
      iVar23 = (int)_Var15._M_p;
      do {
        if (*_Var15._M_p == '\n') goto LAB_0014bead;
        _Var15._M_p = _Var15._M_p + 1;
        uVar16 = (ulong)((int)uVar16 + 1);
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var15._M_p != paVar11);
      uVar16 = (ulong)(uint)((iVar4 + (int)paVar11) - iVar23);
      _Var15._M_p = (pointer)paVar11;
    }
LAB_0014bead:
    for (; (pcVar10 != pcVar5 && (*pcVar10 != '\n')); pcVar10 = pcVar10 + 1) {
      uVar25 = uVar25 + 1;
    }
    bVar19 = false;
  }
joined_r0x0014bebc:
  if (!bVar19) {
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_380._M_dataplus._M_p + local_380._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p == paVar11) goto LAB_0014c565;
    goto LAB_0014bd0e;
  }
LAB_0014bfb0:
  iVar4 = (int)uVar16;
  local_360 = (ulong)uVar25;
  pcVar13 = (pointer)GetLineNumber(this,local_360,false);
  if (pcVar13 == pcVar26) goto LAB_0014c47a;
  lVar7 = std::__cxx11::string::find((char)&local_380,0x20);
  lVar14 = std::__cxx11::string::find((char)&local_380,10);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"");
  local_250 = lVar14;
  if (lVar7 < lVar14 && lVar7 != -1) {
    std::__cxx11::string::substr((ulong)local_338,(ulong)&local_380);
LAB_0014c088:
    std::__cxx11::string::operator=((string *)&local_358,(string *)local_338);
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_);
    }
  }
  else if (lVar14 != -1) {
    std::__cxx11::string::substr((ulong)local_338,(ulong)&local_380);
    goto LAB_0014c088;
  }
  cVar3 = (char)local_2e0;
  lVar7 = std::__cxx11::string::find(cVar3,0x20);
  lVar14 = std::__cxx11::string::find(cVar3,10);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300);
  if (lVar7 < lVar14 && lVar7 != -1) {
    std::__cxx11::string::substr((ulong)local_338,(ulong)local_2e0);
LAB_0014c17f:
    std::__cxx11::string::operator=((string *)&local_300,(string *)local_338);
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_);
    }
  }
  else if (local_250 != -1) {
    std::__cxx11::string::substr((ulong)local_338,(ulong)local_2e0);
    goto LAB_0014c17f;
  }
  sVar2 = local_358._M_string_length;
  if ((local_2f8 == (char *)local_358._M_string_length) &&
     ((local_2f8 == (char *)0x0 ||
      (iVar4 = bcmp(local_300,local_358._M_dataplus._M_p,(size_t)local_2f8), iVar4 == 0)))) {
    std::__cxx11::string::_M_replace((ulong)&local_358,0,(char *)sVar2,0x1781c6);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_300);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_300,0,local_2f8,0x1781d2);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_358);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_358,0,(char *)local_358._M_string_length,0x1781d2);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_300);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_300,0,local_2f8,0x1781da);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_358);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_358,0,(char *)local_358._M_string_length,0x1781da);
  }
  if (*local_300 == '\0') {
    std::__cxx11::string::_M_replace((ulong)&local_300,0,local_2f8,0x1781e8);
  }
  if (*local_358._M_dataplus._M_p == '\0') {
    std::__cxx11::string::_M_replace
              ((ulong)&local_358,0,(char *)local_358._M_string_length,0x1781e8);
  }
  local_320 = (char  [8])&local_310;
  local_318 = 0;
  local_310._M_local_buf[0] = '\0';
  local_338._16_8_ = 0xd;
  local_338._0_8_ = pcVar13;
  local_338._8_8_ = pcVar13;
  std::__cxx11::string::_M_replace((ulong)local_320,0,(char *)0x0,0x1781f2);
  std::__cxx11::string::_M_append(local_320,(ulong)local_300);
  std::__cxx11::string::append(local_320);
  std::__cxx11::string::_M_append(local_320,(ulong)local_358._M_dataplus._M_p);
  std::__cxx11::string::append(local_320);
  std::__cxx11::string::append(local_320);
  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
            (&local_2a8,(value_type *)local_338);
  for (; (iVar4 = (int)uVar16,
         _Var15._M_p != local_380._M_dataplus._M_p + local_380._M_string_length &&
         (*_Var15._M_p != '\n')); _Var15._M_p = _Var15._M_p + 1) {
    uVar16 = (ulong)(iVar4 + 1);
  }
  for (; (pcVar10 != (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length &&
         (*pcVar10 != '\n')); pcVar10 = pcVar10 + 1) {
    uVar25 = uVar25 + 1;
  }
  if (local_320 != (char  [8])&local_310) {
    operator_delete((void *)local_320);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  bVar27 = true;
  pcVar26 = pcVar13;
LAB_0014c47a:
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_380._M_dataplus._M_p + local_380._M_string_length);
  bVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var15._M_p != paVar11;
  _Var15._M_p = _Var15._M_p + bVar19;
  uVar16 = (ulong)(iVar4 + (uint)bVar19);
  bVar19 = pcVar10 != (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length;
  pcVar10 = pcVar10 + bVar19;
  uVar25 = uVar25 + bVar19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var15._M_p == paVar11) goto LAB_0014c565;
  goto LAB_0014bd0e;
}

Assistant:

bool Parser::CheckHeader(const char* filename, bool considerSpaceEOL,bool useCVS)
{
  m_TestsDone[HEADER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The header should respect the template");
  m_TestsDescription[HEADER] = val;
  delete [] val;

  bool hasError = false;
  if(!filename)
    {
    std::cout << "CheckHeader(): Please specify an header file or a directory containing headers" << std::endl;
    return false;
    }

  std::vector<std::string> fileNames;
  
  // if there is no space in the name (i.e on linux) we remove the
  // '"' if any. 
  std::string headerFilename = filename;
  if(headerFilename.find(' ') == std::string::npos)
    {
    headerFilename = "";
    for(unsigned long j=0;j<strlen(filename);j++)
      {
      if(filename[j] != '\"')
        {
        headerFilename+=filename[j];
        }
      }
    }

  // Remove quotes if any on linux
  #ifndef WIN32
    if(headerFilename[0] == '"')
      {
      headerFilename = headerFilename.substr(1,headerFilename.size()-2);
      }
  #endif

  // Check if we have a directory or header
  kwssys::Directory directory;
  if(directory.Load(headerFilename.c_str()))
    {
    std::string dirname = headerFilename;
    if(dirname[dirname.size()-1] != '/')
      {
      dirname += "/";
      }

    for(unsigned int i=0;i<directory.GetNumberOfFiles();i++)
      {
      std::string file = directory.GetFile(i);
      std::string fullpath = dirname+file;
      
      if(file!=".." && file!="." && file!="CVS"&& file!= ".svn")
        {
        fileNames.push_back(dirname+file);
        }
      }
    }
  else
    {
    fileNames.push_back(headerFilename);
    }

  // Create a temporary vector of errors
  std::vector<ErrorVectorType> tempErrors;

  std::vector<std::string>::const_iterator itFilename = fileNames.begin();  
  while(itFilename != fileNames.end())
    {
    hasError = false;

    // Read the header file
    std::ifstream file;
    file.open((*itFilename).c_str(), std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open header file: " << (*itFilename).c_str() << std::endl;
      return false;
      }

    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0;
    std::string buffer(buf);
    buffer.resize(fileSize);
    file.close();
    delete [] buf;

    this->ConvertBufferToWindowsFileType(buffer);
    
    ErrorVectorType  tempErrorVector;

    // Check the file char by char
    std::string::const_iterator ith = buffer.begin();
    std::string::const_iterator it = m_Buffer.begin();

    unsigned int pos = 0;
    unsigned int posh = 0;
    long line = -1;


    while((ith != buffer.end()) && (it != m_Buffer.end()))
      {
      // if we have cvs
      if((*ith == '$') && useCVS)
        {
        ith++;
        posh++;
        it++;
        pos++;
        while(((*ith) != '$') && (ith != buffer.end()))
          {
          ith++;
          posh++;
          }
        while(((*it) != '$') && (it != m_Buffer.end()))
          {
          pos++;
          it++;
          }
        //continue;
        }
       
      if((*it) != (*ith))
        {
        // Check if we have a <NA> tag
        if((*ith) == '<')
          {
          auto pos2 = static_cast<long int>(buffer.find("<NA>", posh));
          auto pos3 = static_cast<long int>(buffer.find("<NA>\n", posh));

          // We skip the line
          if(pos3 == static_cast<long int>(posh))
            {
            while(((*ith) != '\n') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != '\n') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          // if we have the tag we skip the word
          else if(pos2 == static_cast<long int>(posh))
            {
            while(((*ith) != ' ') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != ' ') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          }
        // if we should not check the spaces at the end of line
        else if( (!considerSpaceEOL)
          && ((*ith == ' ') || (*it == ' '))
          )
          {
          // search if we are effectively at the end of the line
          bool isAtEnd = true;
          if(*it == ' ')
            {
            std::string::const_iterator ittemp = it;
            while((ittemp != m_Buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }
          else if(*ith == ' ')
            {
            std::string::const_iterator ittemp = ith;
            while((ittemp != buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }

          // If we are at the end we skip the line
          if(!isAtEnd)
            {
            while((ith != buffer.end()) && ((*ith) != '\n'))
              {
              ith++;
              posh++;
              }
            while((it != m_Buffer.end()) && ((*it) != '\n'))
              {
              pos++;
              it++;
              }
            continue;
            }
          }

        // Report the error
        //hasError = true;

        // We report the wrong word and the line
        long l = this->GetLineNumber(pos);
        if(l != line)
          {
          line = l;
          // Find the word
          auto poshw = static_cast<long int>(buffer.find(' ', posh));
          auto poshw2 = static_cast<long int>(buffer.find('\n', posh));
          std::string wordh = "";
          if(poshw!= -1 && poshw < poshw2)
            {
            wordh = buffer.substr(posh,poshw-posh);
            }
          else if (poshw2 != -1)
            {
            wordh = buffer.substr(posh,poshw2-posh-1);
            }

          // Find the word
            auto posw = static_cast<long int>(m_Buffer.find(' ', pos));
            auto posw2 = static_cast<long int>(m_Buffer.find('\n', pos));
            std::string word = "";
            if (posw != -1 && posw < posw2) {
              word = m_Buffer.substr(pos, posw - pos);
            }
          else if (poshw2 != -1)
            {
            word = m_Buffer.substr(pos,posw2-pos-1);
            }

          if(word == wordh)
            {
            wordh = "wrong ident";
            }
         
          if(word == " ")
            {
            word = "[space]";
            }
          if(wordh == " ")
            {
            wordh = "[space]";
            }
         if(word == "\r")
            {
            word = "[end of line]";
            }
          if(wordh == "\r")
            {
            wordh = "[end of line]";
            }
          
          if(word[0] == 0)
            {
            word = "[no char]";
            }
          if(wordh[0] == 0)
            {
            wordh = "[no char]";
            }

          Error error;
          error.line = line;
          error.line2 = error.line;
          error.number = HEADER;
          error.description = "Header mismatch: ";
          error.description += word;
          error.description += " (";
          error.description += wordh;
          error.description += ") : ";
          error.description += headerFilename.c_str();
          tempErrorVector.push_back(error);
          hasError = true;

          // We skip that line   
          while((ith != buffer.end()) && ((*ith) != '\n'))
            {
            ith++;
            posh++;
            }
          while((it != m_Buffer.end()) && ((*it) != '\n'))
            {
            pos++;
            it++;
            }
          }
        }

      if(ith != buffer.end())
        {
        posh++;
        ith++;
        }

      if(it != m_Buffer.end())
        {
        pos++;
        it++;
        }
      }

    if(it == m_Buffer.end())
      {
      Error error;
      error.line = 1;
      error.line2 = error.line;
      error.number = HEADER;
      error.description = "The header is incomplete";
      tempErrorVector.push_back(error);
      hasError = true;
      }

    // If we don't have any errors we return the current errors
    if(!hasError)
      {
      m_HeaderFilename = *itFilename;
      ErrorVectorType::const_iterator itErr = tempErrorVector.begin();
      while(itErr != tempErrorVector.end())
        {
        m_ErrorList.push_back(*itErr);
        itErr++;
        }
      return true;
      }

    tempErrors.push_back(tempErrorVector);

    itFilename++;
    } // end loop of filenames

  // We check the less errors we can have
  unsigned int header=0;
  int minErrors = 9999999;
  unsigned int i=0;
  std::vector<ErrorVectorType>::const_iterator itErrV = tempErrors.begin();
  while(itErrV != tempErrors.end())
    {
    if((int)(*itErrV).size() < minErrors)
      {
      header = i;
      minErrors = static_cast<int>((*itErrV).size());
      }
    i++;
    itErrV++;
    }
 
  ErrorVectorType::const_iterator itErr = tempErrors[header].begin();
  while(itErr != tempErrors[header].end())
    {
    m_ErrorList.push_back(*itErr);
    itErr++;
    }

  m_HeaderFilename = fileNames[header];
  return !hasError;
}